

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

void __thiscall
MODEL3D::three_dim_model::add_right_plane
          (three_dim_model *this,int *n,int *gain,int *depth,
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
          *lines_map,
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *curve_loops_map,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *plane_surfaces_map,int *base_points_count,int *panel_count,
          vector<int,_std::allocator<int>_> *roof_line_vector,int *prev_cl_count,int *prev_pls_count
          ,int *prev_pnt_count)

{
  iterator __position;
  void *pvVar1;
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  *p_Var2;
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  *this_00;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  three_dim_model *this_01;
  int iVar10;
  ulong uVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  int line_count;
  allocator_type local_d9;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> vStack_d0;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong local_a8;
  ulong local_a0;
  int local_94;
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  *local_90;
  vector<int,_std::allocator<int>_> local_88;
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  *local_70;
  uint *local_68;
  uint *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_90 = (_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)lines_map;
  local_60 = (uint *)n;
  lVar4 = std::_Rb_tree_decrement(&(lines_map->_M_t)._M_impl.super__Rb_tree_header._M_header);
  line_count = *(int *)(lVar4 + 0x20);
  puVar5 = (uint *)prev_cl_count;
  if ((curve_loops_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar4 = std::_Rb_tree_decrement
                      (&(curve_loops_map->_M_t)._M_impl.super__Rb_tree_header._M_header);
    puVar5 = (uint *)(lVar4 + 0x20);
  }
  local_a0 = (ulong)*puVar5;
  puVar5 = (uint *)prev_pls_count;
  if ((plane_surfaces_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar4 = std::_Rb_tree_decrement
                      (&(plane_surfaces_map->_M_t)._M_impl.super__Rb_tree_header._M_header);
    puVar5 = (uint *)(lVar4 + 0x20);
  }
  local_a8 = (ulong)*puVar5;
  iVar6 = 0;
  local_70 = (_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)curve_loops_map;
  local_68 = (uint *)depth;
  do {
    p_Var2 = local_90;
    uVar8 = *local_60;
    iVar7 = *panel_count * *depth;
    iVar10 = iVar7 + *prev_pnt_count + *base_points_count + 1;
    uVar3 = *prev_pnt_count + *base_points_count + iVar7;
    local_58 = (ulong)uVar3;
    iVar7 = *depth + uVar3 + 1;
    line_count = line_count + 1;
    local_d8._0_4_ = line_count;
    local_d8._4_4_ = uVar8;
    vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = iVar10;
    local_94 = iVar6;
    std::
    _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
    ::_M_insert_unique<std::pair<int_const,GEO::line>>
              (local_90,(pair<const_int,_GEO::line> *)local_d8);
    line_count = line_count + 1;
    local_d8._0_4_ = line_count;
    local_d8._4_4_ = iVar10;
    vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = iVar7;
    std::
    _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
    ::_M_insert_unique<std::pair<int_const,GEO::line>>
              (p_Var2,(pair<const_int,_GEO::line> *)local_d8);
    line_count = line_count + 1;
    local_d8._0_4_ = line_count;
    local_d8._4_4_ = iVar7;
    vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = uVar8;
    std::
    _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
    ::_M_insert_unique<std::pair<int_const,GEO::line>>
              (p_Var2,(pair<const_int,_GEO::line> *)local_d8);
    local_b4 = line_count + -2;
    local_b0 = line_count + -1;
    local_ac = line_count;
    __l._M_len = 3;
    __l._M_array = &local_b4;
    std::vector<int,_std::allocator<int>_>::vector(&local_88,__l,&local_d9);
    uVar8 = (int)local_a0 + 1;
    local_d8._0_4_ = uVar8;
    std::vector<int,_std::allocator<int>_>::vector(&vStack_d0,&local_88);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
              (local_70,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_d8);
    depth = (int *)local_68;
    pvVar1 = (void *)CONCAT44(vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar9 = (int)local_a8 + 1;
    this_01 = (three_dim_model *)plane_surfaces_map;
    local_d8._0_4_ = uVar9;
    local_d8._4_4_ = uVar8;
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::_M_insert_unique<std::pair<int_const,int>>
              ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                *)plane_surfaces_map,(pair<const_int,_int> *)local_d8);
    uVar3 = *depth;
    if (1 < (int)uVar3) {
      uVar11 = 1;
      uVar9 = 0;
      do {
        p_Var2 = local_90;
        local_48 = (ulong)uVar9;
        local_40 = (ulong)uVar3;
        iVar6 = (int)uVar11;
        uVar9 = (int)local_58 + iVar6;
        iVar7 = (int)local_58 + iVar6 + 1;
        uVar8 = uVar3 + uVar9 + 1;
        line_count = line_count + 1;
        local_d8._0_4_ = line_count;
        local_d8._4_4_ = uVar9;
        vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar7;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  (local_90,(pair<const_int,_GEO::line> *)local_d8);
        line_count = line_count + 1;
        local_d8._0_4_ = line_count;
        local_d8._4_4_ = iVar7;
        vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = uVar8;
        local_38 = (ulong)uVar8;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  (p_Var2,(pair<const_int,_GEO::line> *)local_d8);
        local_50 = uVar11;
        if (iVar6 == *local_68 - 1) {
          __position._M_current =
               (roof_line_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (roof_line_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)roof_line_vector,__position,&line_count);
          }
          else {
            *__position._M_current = line_count;
            (roof_line_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        uVar11 = local_38;
        p_Var2 = local_90;
        uVar8 = uVar9 + (int)local_40;
        line_count = line_count + 1;
        unique0x00004a80 = (line)(((ulong)uVar9 << 0x20) + local_38);
        local_d8._0_4_ = line_count;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  (local_90,(pair<const_int,_GEO::line> *)local_d8);
        line_count = line_count + 1;
        vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = uVar8 | (uint)(uVar11 >> 0x20);
        local_d8._4_4_ = (undefined4)uVar11;
        local_d8._0_4_ = line_count;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  (p_Var2,(pair<const_int,_GEO::line> *)local_d8);
        line_count = line_count + 1;
        local_d8._0_4_ = line_count;
        local_d8._4_4_ = uVar8;
        vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = uVar9;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  (p_Var2,(pair<const_int,_GEO::line> *)local_d8);
        local_b4 = line_count + -4;
        local_b0 = line_count + -3;
        local_ac = line_count + -2;
        __l_00._M_len = 3;
        __l_00._M_array = &local_b4;
        std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_00,&local_d9);
        iVar6 = (int)local_48;
        iVar7 = (int)local_a0 + iVar6 + 2;
        local_d8._0_4_ = iVar7;
        std::vector<int,_std::allocator<int>_>::vector(&vStack_d0,&local_88);
        this_00 = local_70;
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                  (local_70,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_d8);
        pvVar1 = (void *)CONCAT44(vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (uint)vStack_d0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)vStack_d0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_d8._0_4_ = (int)local_a8 + iVar6 + 2;
        local_d8._4_4_ = iVar7;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_insert_unique<std::pair<int_const,int>>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)plane_surfaces_map,(pair<const_int,_int> *)local_d8);
        local_b4 = 2 - line_count;
        local_b0 = line_count + -1;
        local_ac = line_count;
        __l_01._M_len = 3;
        __l_01._M_array = &local_b4;
        std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_01,&local_d9);
        uVar8 = (int)local_a0 + iVar6 + 3;
        local_d8._0_4_ = uVar8;
        std::vector<int,_std::allocator<int>_>::vector(&vStack_d0,&local_88);
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                  (this_00,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_d8);
        pvVar1 = (void *)CONCAT44(vStack_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (uint)vStack_d0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)vStack_d0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_d8._0_4_ = (int)local_a8 + iVar6 + 3;
        this_01 = (three_dim_model *)plane_surfaces_map;
        local_d8._4_4_ = uVar8;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_insert_unique<std::pair<int_const,int>>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)plane_surfaces_map,(pair<const_int,_int> *)local_d8);
        uVar8 = (int)local_50 + 1;
        uVar11 = (ulong)uVar8;
        uVar3 = *local_68;
        uVar9 = iVar6 + 2;
      } while ((int)uVar8 < (int)uVar3);
      uVar8 = (int)local_a0 + uVar9 + 1;
      uVar9 = uVar9 + (int)local_a8 + 1;
      depth = (int *)local_68;
    }
    *panel_count = *panel_count + 1;
    iVar6 = local_94 + 1;
    local_a0 = (ulong)uVar8;
    local_a8 = (ulong)uVar9;
  } while (iVar6 != 6);
  add_normal_plane(this_01,(int *)local_60,panel_count,depth,
                   (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                    *)local_90,
                   (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)local_70,plane_surfaces_map,base_points_count,panel_count,roof_line_vector,
                   prev_cl_count,prev_pls_count,prev_pnt_count);
  return;
}

Assistant:

void MODEL3D::three_dim_model::add_right_plane(
int &n, int &gain, int &depth,
std::map<int, GEO::line> &lines_map,
std::map<int, std::vector<int>> &curve_loops_map,
std::map<int, int> &plane_surfaces_map,
const int &base_points_count,
int &panel_count,
std::vector<int> &roof_line_vector,
const int &prev_cl_count,
const int &prev_pls_count,
const int &prev_pnt_count)
{
    // Setting up the counter values ========================================
    int line_count = std::prev(lines_map.end(),1)->first;
    int curve_loop_count;
    if (!curve_loops_map.empty())
        curve_loop_count = std::prev(curve_loops_map.end(),1)->first;
    else
        curve_loop_count = prev_cl_count;
    int plane_surfaces_count;
    if(!plane_surfaces_map.empty())
        plane_surfaces_count = std::prev(plane_surfaces_map.end(),1)->first;
    else
        plane_surfaces_count = prev_pls_count;
    // Loop through six panels
    for ( int corner_cnt = 0; corner_cnt < 6; corner_cnt++)
    {
        // Creating the ground-level plane surface ===============================
        //c<--b
        //v + ^                             <-- Loop to form plane surface
        //d-->a
        GEO::line a, b, c, d, diag;
        a.start = n;                        // initial point of plane surface
        a.end   = base_points_count + 1 + prev_pnt_count + depth * panel_count;
        b.start = a.end;
        b.end   = b.start + depth;
        c.start = b.end;
        c.end   = a.start;
        lines_map.insert({++line_count, a});
        lines_map.insert({++line_count, b});
        lines_map.insert({++line_count, c});
        curve_loops_map.insert(
        {++curve_loop_count,
        {line_count-2, line_count-1,
        line_count} } );
        plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
        // Creating the higher plane surfaces ===============================
        for ( int level_deep = 1; level_deep < depth; level_deep++)
        {
            a.start           = a.end;
            a.end          = a.end + 1;
            b.start           = a.end;
            b.end          = b.start + depth;
            c.start          = b.end;
            c.end           = c.start - 1;
            d.start          = c.end;
            d.end           = a.start;
            diag.start       = b.end;
            diag.end        = a.start;
            lines_map.insert({++line_count, a});
            lines_map.insert({++line_count, b});
            if(level_deep==(depth-1))
                roof_line_vector.push_back(line_count);
            lines_map.insert({++line_count, diag});
            lines_map.insert({++line_count, c});
            lines_map.insert({++line_count, d});
            curve_loops_map.insert( {++curve_loop_count,
                                    {(line_count-4), (line_count-3), (line_count-2)} } );
            plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
            curve_loops_map.insert( {++curve_loop_count,
                                    {(-1*(line_count-2)), (line_count-1), (line_count)} } );
            plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
        }
        panel_count++;
    }
    //treat the follow-up panel as a normal plane
    add_normal_plane(   n, gain, depth,
                        lines_map,
                        curve_loops_map,
                        plane_surfaces_map,
                        base_points_count,
                        panel_count,
                        roof_line_vector,
                        prev_cl_count,
                        prev_pls_count,
                        prev_pnt_count);
}